

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

bool sc_dt::operator==(uint64 u,sc_signed *v)

{
  sc_digit vlen;
  int iVar1;
  sc_digit *in_RSI;
  undefined8 in_RDI;
  sc_digit ud [3];
  small_type us;
  unsigned_long_long *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  iVar1 = (int)((ulong)in_RDI >> 0x20);
  vlen = get_sign<unsigned_long_long>(in_stack_ffffffffffffffd8);
  from_uint<unsigned_long_long>(iVar1,in_RSI,CONCAT44(vlen,in_stack_ffffffffffffffe0));
  if (vlen == in_RSI[2]) {
    iVar1 = vec_skip_and_cmp(iVar1,in_RSI,vlen,(sc_digit *)in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
operator==(uint64 u, const sc_signed& v)
{

  CONVERT_INT64(u);

  if (us != v.sgn)
    return false;

  if (vec_skip_and_cmp(DIGITS_PER_INT64, ud, v.ndigits, v.digit) != 0)
    return false;

  return true;

}